

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
fasttext::Dictionary::getSubwords(Dictionary *this,int32_t i)

{
  if (i < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/olegtarasov[P]fastText/src/dictionary.cc"
                  ,0x56,
                  "const std::vector<int32_t> &fasttext::Dictionary::getSubwords(int32_t) const");
  }
  if (i < this->nwords_) {
    return &(this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
            _M_impl.super__Vector_impl_data._M_start[(uint)i].subwords;
  }
  __assert_fail("i < nwords_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/olegtarasov[P]fastText/src/dictionary.cc"
                ,0x57,"const std::vector<int32_t> &fasttext::Dictionary::getSubwords(int32_t) const"
               );
}

Assistant:

const std::vector<int32_t>& Dictionary::getSubwords(int32_t i) const {
  assert(i >= 0);
  assert(i < nwords_);
  return words_[i].subwords;
}